

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_address.cpp
# Opt level: O1

AddressFactory * __thiscall
cfd::AddressFactory::CreateAddress
          (AddressFactory *this,AddressType address_type,Pubkey *pubkey,Script *script,
          Script *locking_script,Script *redeem_script)

{
  char cVar1;
  CfdException *pCVar2;
  undefined4 in_register_00000034;
  long lVar3;
  Script *in_stack_00000008;
  Script temp_script;
  AddressType local_1fc;
  undefined1 local_1f8 [32];
  uchar local_1d8 [16];
  pointer local_1c8;
  void *local_1b0;
  void *local_198;
  code *local_180 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_108;
  Script local_f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_b0;
  Pubkey local_80;
  Script local_68;
  
  lVar3 = CONCAT44(in_register_00000034,address_type);
  local_1fc = (AddressType)pubkey;
  if ((((script == (Script *)0x0) || (cVar1 = cfd::core::Pubkey::IsValid(), cVar1 == '\0')) &&
      (local_1fc < kWitnessUnknown)) && ((0xd4U >> (local_1fc & 0x1f) & 1) != 0)) {
    local_1f8._0_8_ = "cfd_address.cpp";
    local_1f8._8_4_ = 0xe4;
    local_1f8._16_8_ = "CreateAddress";
    core::logger::log<>((CfdSourceLocation *)local_1f8,kCfdLogLevelWarning,
                        "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"pubkey hex is empty.","");
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1f8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  if (((locking_script == (Script *)0x0) || (cVar1 = cfd::core::Script::IsEmpty(), cVar1 != '\0'))
     && ((local_1fc < kP2shP2wpkhAddress && ((0x2aU >> (local_1fc & 0x1f) & 1) != 0)))) {
    local_1f8._0_8_ = "cfd_address.cpp";
    local_1f8._8_4_ = 0xef;
    local_1f8._16_8_ = "CreateAddress";
    core::logger::log<>((CfdSourceLocation *)local_1f8,kCfdLogLevelWarning,
                        "Failed to CreateAddress. Invalid script hex: script is empty.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"script hex is empty.","");
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1f8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cfd::core::Address::Address((Address *)this);
  cfd::core::Script::Script(&local_68);
  switch(local_1fc) {
  case kP2shAddress:
    cfd::core::Address::Address
              ((Address *)local_1f8,*(NetType *)(lVar3 + 8),locking_script,(vector *)(lVar3 + 0x10))
    ;
    cfd::core::Address::operator=((Address *)this,(Address *)local_1f8);
    break;
  case kP2pkhAddress:
    cfd::core::Address::Address
              ((Address *)local_1f8,*(NetType *)(lVar3 + 8),(Pubkey *)script,
               (vector *)(lVar3 + 0x10));
    cfd::core::Address::operator=((Address *)this,(Address *)local_1f8);
    break;
  case kP2wshAddress:
    cfd::core::Address::Address
              ((Address *)local_1f8,*(NetType *)(lVar3 + 8),kVersion0,locking_script,
               (vector *)(lVar3 + 0x10));
    cfd::core::Address::operator=((Address *)this,(Address *)local_1f8);
    break;
  case kP2wpkhAddress:
    cfd::core::Address::Address
              ((Address *)local_1f8,*(NetType *)(lVar3 + 8),kVersion0,(Pubkey *)script,
               (vector *)(lVar3 + 0x10));
    cfd::core::Address::operator=((Address *)this,(Address *)local_1f8);
    break;
  case kP2shP2wshAddress:
    cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)local_1f8);
    cfd::core::Script::operator=(&local_68,(Script *)local_1f8);
    core::Script::~Script((Script *)local_1f8);
    cfd::core::Address::Address
              ((Address *)local_1f8,*(NetType *)(lVar3 + 8),&local_68,(vector *)(lVar3 + 0x10));
    cfd::core::Address::operator=((Address *)this,(Address *)local_1f8);
    goto LAB_001e0059;
  case kP2shP2wpkhAddress:
    cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Pubkey *)local_1f8);
    cfd::core::Script::operator=(&local_68,(Script *)local_1f8);
    core::Script::~Script((Script *)local_1f8);
    cfd::core::Address::Address
              ((Address *)local_1f8,*(NetType *)(lVar3 + 8),&local_68,(vector *)(lVar3 + 0x10));
    cfd::core::Address::operator=((Address *)this,(Address *)local_1f8);
LAB_001e0059:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_b0);
    core::Script::~Script(&local_f0);
    local_180[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_108);
    core::TapBranch::~TapBranch((TapBranch *)local_180);
    if (local_198 != (void *)0x0) {
      operator_delete(local_198);
    }
    if (local_1b0 != (void *)0x0) {
      operator_delete(local_1b0);
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if ((uchar *)local_1f8._16_8_ != local_1d8) {
      operator_delete((void *)local_1f8._16_8_);
    }
    if (in_stack_00000008 != (Script *)0x0) {
      cfd::core::Script::operator=(in_stack_00000008,&local_68);
    }
    goto LAB_001e01d4;
  case kTaprootAddress:
    cfd::core::SchnorrPubkey::FromPubkey(&local_80,(bool *)script);
    cfd::core::Address::Address
              ((Address *)local_1f8,*(NetType *)(lVar3 + 8),kVersion1,(SchnorrPubkey *)&local_80,
               (vector *)(lVar3 + 0x10));
    cfd::core::Address::operator=((Address *)this,(Address *)local_1f8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_b0);
    core::Script::~Script(&local_f0);
    local_180[0] = cfd::core::Psbt::CheckTxInIndex;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_108);
    core::TapBranch::~TapBranch((TapBranch *)local_180);
    if (local_198 != (void *)0x0) {
      operator_delete(local_198);
    }
    if (local_1b0 != (void *)0x0) {
      operator_delete(local_1b0);
    }
    if (local_1c8 != (pointer)0x0) {
      operator_delete(local_1c8);
    }
    if ((uchar *)local_1f8._16_8_ != local_1d8) {
      operator_delete((void *)local_1f8._16_8_);
    }
    if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (uchar *)0x0) goto LAB_001e01d4;
    goto LAB_001dfffb;
  default:
    local_1f8._0_8_ = "cfd_address.cpp";
    local_1f8._8_4_ = 0x118;
    local_1f8._16_8_ = "CreateAddress";
    core::logger::log<cfd::core::AddressType&>
              ((CfdSourceLocation *)local_1f8,kCfdLogLevelWarning,
               "Failed to CreateAddress. Invalid address type:  address_type={}",&local_1fc);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_1f8._0_8_ = local_1f8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1f8,
               "Invalid address_type. address_type must be \"p2pkh\" or \"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or \"p2sh-p2wsh\"."
               ,"");
    core::CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_1f8);
    __cxa_throw(pCVar2,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_b0);
  core::Script::~Script(&local_f0);
  local_180[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_108);
  core::TapBranch::~TapBranch((TapBranch *)local_180);
  if (local_198 != (void *)0x0) {
    operator_delete(local_198);
  }
  if (local_1b0 != (void *)0x0) {
    operator_delete(local_1b0);
  }
  if (local_1c8 != (pointer)0x0) {
    operator_delete(local_1c8);
  }
  local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_1f8._16_8_;
  if ((uchar *)local_1f8._16_8_ != local_1d8) {
LAB_001dfffb:
    operator_delete(local_80.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_001e01d4:
  if (redeem_script != (Script *)0x0) {
    cfd::core::Address::GetLockingScript();
    cfd::core::Script::operator=(redeem_script,(Script *)local_1f8);
    core::Script::~Script((Script *)local_1f8);
  }
  core::Script::~Script(&local_68);
  return this;
}

Assistant:

Address AddressFactory::CreateAddress(
    AddressType address_type, const Pubkey* pubkey, const Script* script,
    Script* locking_script, Script* redeem_script) const {
  if ((pubkey == nullptr) || (!pubkey->IsValid())) {
    if (address_type == AddressType::kP2pkhAddress ||
        address_type == AddressType::kP2wpkhAddress ||
        address_type == AddressType::kP2shP2wpkhAddress ||
        address_type == AddressType::kTaprootAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid pubkey hex: pubkey is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "pubkey hex is empty.");
    }
  }
  if ((script == nullptr) || (script->IsEmpty())) {
    if (address_type == AddressType::kP2shAddress ||
        address_type == AddressType::kP2wshAddress ||
        address_type == AddressType::kP2shP2wshAddress) {
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid script hex: script is empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "script hex is empty.");
    }
  }
  Address addr;

  Script temp_script;
  switch (address_type) {
    case AddressType::kP2pkhAddress:
      addr = CreateP2pkhAddress(*pubkey);
      break;
    case AddressType::kP2shAddress:
      addr = CreateP2shAddress(*script);
      break;
    case AddressType::kP2wpkhAddress:
      addr = CreateP2wpkhAddress(*pubkey);
      break;
    case AddressType::kP2wshAddress:
      addr = CreateP2wshAddress(*script);
      break;
    case AddressType::kP2shP2wpkhAddress:
      temp_script = ScriptUtil::CreateP2wpkhLockingScript(*pubkey);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kP2shP2wshAddress:
      temp_script = ScriptUtil::CreateP2wshLockingScript(*script);
      addr = CreateP2shAddress(temp_script);
      if (redeem_script != nullptr) {
        *redeem_script = temp_script;
      }
      break;
    case AddressType::kTaprootAddress:
      addr = CreateTaprootAddress(SchnorrPubkey::FromPubkey(*pubkey));
      break;
    default:
      warn(
          CFD_LOG_SOURCE,
          "Failed to CreateAddress. Invalid address type:  address_type={}",
          address_type);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid address_type. address_type must be \"p2pkh\" or "
          "\"p2sh\" or \"p2wpkh\" or \"p2wsh\" or \"p2sh-p2wpkh\" or "
          "\"p2sh-p2wsh\".");  // NOLINT
      break;
  }
  if (locking_script != nullptr) {
    *locking_script = addr.GetLockingScript();
  }

  return addr;
}